

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

bool __thiscall
cmake::FindPackage(cmake *this,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  Snapshot snapshot;
  pointer pbVar1;
  byte bVar2;
  auto_ptr<cmLocalGenerator> aVar3;
  bool bVar4;
  cmGlobalGenerator *this_01;
  cmLocalGenerator *pcVar5;
  cmMakefile *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  cmTarget *this_02;
  reference lib;
  bool in_DL;
  bool collapse;
  bool collapse_00;
  bool collapse_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  cmGeneratorTarget *local_4b8;
  cmGeneratorTarget *gtgt;
  string linkFlags;
  string flags;
  string linkPath;
  string frameworkPath;
  string linkLibs;
  string local_408;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_3d8;
  const_iterator libIt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libList;
  string local_3b0;
  undefined1 local_390 [8];
  string libs;
  string local_368;
  cmTarget *local_348;
  cmTarget *tgt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  char *targetName;
  string local_318;
  string local_2f8 [8];
  string definitions;
  string local_2d0;
  undefined1 local_2b0 [8];
  string includeFlags;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includeDirs;
  string local_270;
  undefined1 local_250 [8];
  string includes;
  string local_228;
  byte local_202;
  allocator local_201;
  undefined1 local_200 [6];
  bool quiet;
  byte local_1db;
  allocator local_1da;
  allocator local_1d9;
  undefined1 local_1d8 [5];
  bool packageFound;
  string local_1b8 [8];
  string packageName;
  string local_190;
  undefined1 local_170 [8];
  string mode;
  string local_148;
  undefined1 local_128 [8];
  string language;
  string systemFile;
  string local_c8;
  cmMakefile *local_a8;
  cmMakefile *mf;
  Snapshot local_90;
  auto_ptr<cmLocalGenerator> local_78;
  auto_ptr<cmLocalGenerator> lg;
  cmGlobalGenerator *gg;
  string local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_18;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmake *this_local;
  
  local_18 = args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_(&local_38,(SystemTools *)0x1,in_DL);
  SetHomeDirectory(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)&gg,(SystemTools *)0x1,collapse);
  SetHomeOutputDirectory(this,(string *)&gg);
  std::__cxx11::string::~string((string *)&gg);
  this_01 = (cmGlobalGenerator *)operator_new(0x5c8);
  cmGlobalGenerator::cmGlobalGenerator(this_01,this);
  lg.x_ = (cmLocalGenerator *)this_01;
  SetGlobalGenerator(this,this_01);
  aVar3.x_ = lg.x_;
  cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator((iterator *)&mf);
  cmState::Snapshot::Snapshot(&local_90,(cmState *)0x0,_mf);
  snapshot.Position.Tree._0_4_ = (int)local_90.Position.Tree;
  snapshot.State = local_90.State;
  snapshot.Position.Tree._4_4_ = (int)((ulong)local_90.Position.Tree >> 0x20);
  snapshot.Position.Position = local_90.Position.Position;
  pcVar5 = cmGlobalGenerator::MakeLocalGenerator(aVar3.x_,snapshot,(cmLocalGenerator *)0x0);
  cmsys::auto_ptr<cmLocalGenerator>::auto_ptr(&local_78,pcVar5);
  pcVar5 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_78);
  pcVar6 = cmLocalGenerator::GetMakefile(pcVar5);
  local_a8 = pcVar6;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            (&local_c8,(SystemTools *)0x1,collapse_00);
  cmMakefile::SetCurrentBinaryDirectory(pcVar6,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  pcVar6 = local_a8;
  cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
            ((string *)((long)&systemFile.field_2 + 8),(SystemTools *)0x1,collapse_01);
  cmMakefile::SetCurrentSourceDirectory(pcVar6,(string *)((long)&systemFile.field_2 + 8));
  std::__cxx11::string::~string((string *)(systemFile.field_2._M_local_buf + 8));
  cmMakefile::SetArgcArgv(local_a8,local_18);
  cmMakefile::GetModulesFile_abi_cxx11_
            ((string *)((long)&language.field_2 + 8),local_a8,"CMakeFindPackageMode.cmake");
  pcVar6 = local_a8;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  cmMakefile::ReadListFile(pcVar6,pcVar7);
  pcVar6 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"LANGUAGE",(allocator *)(mode.field_2._M_local_buf + 0xf));
  pcVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_148);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_128,pcVar7,(allocator *)(mode.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(mode.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)(mode.field_2._M_local_buf + 0xf));
  pcVar6 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_190,"MODE",(allocator *)(packageName.field_2._M_local_buf + 0xf));
  pcVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_190);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_170,pcVar7,(allocator *)(packageName.field_2._M_local_buf + 0xe));
  std::allocator<char>::~allocator((allocator<char> *)(packageName.field_2._M_local_buf + 0xe));
  std::__cxx11::string::~string((string *)&local_190);
  std::allocator<char>::~allocator((allocator<char> *)(packageName.field_2._M_local_buf + 0xf));
  pcVar6 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_1d8,"NAME",&local_1d9);
  pcVar7 = cmMakefile::GetSafeDefinition(pcVar6,(string *)local_1d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1b8,pcVar7,&local_1da);
  std::allocator<char>::~allocator((allocator<char> *)&local_1da);
  std::__cxx11::string::~string((string *)local_1d8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
  pcVar6 = local_a8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_200,"PACKAGE_FOUND",&local_201);
  bVar4 = cmMakefile::IsOn(pcVar6,(string *)local_200);
  std::__cxx11::string::~string((string *)local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  pcVar6 = local_a8;
  local_1db = bVar4;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_228,"PACKAGE_QUIET",(allocator *)(includes.field_2._M_local_buf + 0xf)
            );
  bVar4 = cmMakefile::IsOn(pcVar6,&local_228);
  std::__cxx11::string::~string((string *)&local_228);
  std::allocator<char>::~allocator((allocator<char> *)(includes.field_2._M_local_buf + 0xf));
  local_202 = bVar4;
  if ((local_1db & 1) == 0) {
    if (!bVar4) {
      uVar8 = std::__cxx11::string::c_str();
      printf("%s not found.\n",uVar8);
    }
  }
  else {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_170,"EXIST");
    if (bVar4) {
      if ((local_202 & 1) == 0) {
        uVar8 = std::__cxx11::string::c_str();
        printf("%s found.\n",uVar8);
      }
    }
    else {
      bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_170,"COMPILE");
      pcVar6 = local_a8;
      if (bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_270,"PACKAGE_INCLUDE_DIRS",
                   (allocator *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        pcVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_270);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)local_250,pcVar7,
                   (allocator *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
        std::__cxx11::string::~string((string *)&local_270);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&includeDirs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
        this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&includeFlags.field_2 + 8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(this_00);
        cmSystemTools::ExpandListArgument((string *)local_250,this_00,false);
        pcVar5 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_78);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_2d0,"",(allocator *)(definitions.field_2._M_local_buf + 0xf));
        cmLocalGenerator::GetIncludeFlags
                  ((string *)local_2b0,pcVar5,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&includeFlags.field_2 + 8),(cmGeneratorTarget *)0x0,(string *)local_128
                   ,false,false,&local_2d0);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)(definitions.field_2._M_local_buf + 0xf));
        pcVar6 = local_a8;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_318,"PACKAGE_DEFINITIONS",(allocator *)((long)&targetName + 7));
        pcVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_318);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_2f8,pcVar7,(allocator *)((long)&targetName + 6));
        std::allocator<char>::~allocator((allocator<char> *)((long)&targetName + 6));
        std::__cxx11::string::~string((string *)&local_318);
        std::allocator<char>::~allocator((allocator<char> *)((long)&targetName + 7));
        uVar8 = std::__cxx11::string::c_str();
        uVar9 = std::__cxx11::string::c_str();
        printf("%s %s\n",uVar8,uVar9);
        std::__cxx11::string::~string(local_2f8);
        std::__cxx11::string::~string((string *)local_2b0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&includeFlags.field_2 + 8));
        std::__cxx11::string::~string((string *)local_250);
      }
      else {
        bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_170,"LINK");
        if (bVar4) {
          srcs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)anon_var_dwarf_86d90;
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&tgt);
          this_02 = cmMakefile::AddExecutable
                              (local_a8,(char *)srcs.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)&tgt,true);
          local_348 = this_02;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_368,"LINKER_LANGUAGE",
                     (allocator *)(libs.field_2._M_local_buf + 0xf));
          pcVar7 = (char *)std::__cxx11::string::c_str();
          cmTarget::SetProperty(this_02,&local_368,pcVar7);
          std::__cxx11::string::~string((string *)&local_368);
          std::allocator<char>::~allocator((allocator<char> *)(libs.field_2._M_local_buf + 0xf));
          pcVar6 = local_a8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_3b0,"PACKAGE_LIBRARIES",
                     (allocator *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          pcVar7 = cmMakefile::GetSafeDefinition(pcVar6,&local_3b0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_390,pcVar7,
                     (allocator *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 6));
          std::__cxx11::string::~string((string *)&local_3b0);
          std::allocator<char>::~allocator
                    ((allocator<char> *)
                     ((long)&libList.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&libIt);
          cmSystemTools::ExpandListArgument
                    ((string *)local_390,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&libIt,false);
          local_3e0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&libIt);
          __gnu_cxx::
          __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
          ::__normal_iterator<std::__cxx11::string*>
                    ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      *)&local_3d8,&local_3e0);
          while( true ) {
            local_3e8._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&libIt);
            bVar4 = __gnu_cxx::operator!=(&local_3d8,&local_3e8);
            pcVar6 = local_a8;
            pbVar1 = srcs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
            if (!bVar4) break;
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_408,(char *)pbVar1,
                       (allocator *)(linkLibs.field_2._M_local_buf + 0xf));
            lib = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_3d8);
            cmMakefile::AddLinkLibraryForTarget(pcVar6,&local_408,lib,GENERAL);
            std::__cxx11::string::~string((string *)&local_408);
            std::allocator<char>::~allocator
                      ((allocator<char> *)(linkLibs.field_2._M_local_buf + 0xf));
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_3d8);
          }
          std::__cxx11::string::string((string *)(frameworkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(flags.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)(linkFlags.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)&gtgt);
          aVar3 = lg;
          pcVar5 = cmsys::auto_ptr<cmLocalGenerator>::get(&local_78);
          cmGlobalGenerator::CreateGeneratorTargets((cmGlobalGenerator *)aVar3.x_,pcVar5);
          local_4b8 = cmGlobalGenerator::GetGeneratorTarget((cmGlobalGenerator *)lg.x_,local_348);
          pcVar5 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_78);
          cmLocalGenerator::GetTargetFlags
                    (pcVar5,(string *)((long)&frameworkPath.field_2 + 8),
                     (string *)((long)&linkPath.field_2 + 8),(string *)((long)&flags.field_2 + 8),
                     (string *)((long)&linkFlags.field_2 + 8),(string *)&gtgt,local_4b8,false);
          std::operator+(&local_4f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&linkPath.field_2 + 8),
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&flags.field_2 + 8));
          std::operator+(&local_4d8,&local_4f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&frameworkPath.field_2 + 8));
          std::__cxx11::string::operator=
                    ((string *)(frameworkPath.field_2._M_local_buf + 8),(string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4d8);
          std::__cxx11::string::~string((string *)&local_4f8);
          uVar8 = std::__cxx11::string::c_str();
          printf("%s\n",uVar8);
          std::__cxx11::string::~string((string *)&gtgt);
          std::__cxx11::string::~string((string *)(linkFlags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(flags.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
          std::__cxx11::string::~string((string *)(frameworkPath.field_2._M_local_buf + 8));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&libIt);
          std::__cxx11::string::~string((string *)local_390);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tgt);
        }
      }
    }
  }
  bVar2 = local_1db;
  std::__cxx11::string::~string(local_1b8);
  std::__cxx11::string::~string((string *)local_170);
  std::__cxx11::string::~string((string *)local_128);
  std::__cxx11::string::~string((string *)(language.field_2._M_local_buf + 8));
  cmsys::auto_ptr<cmLocalGenerator>::~auto_ptr(&local_78);
  return (bool)(bVar2 & 1);
}

Assistant:

bool cmake::FindPackage(const std::vector<std::string>& args)
{
  this->SetHomeDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());

  // if a generator was not yet created, temporarily create one
  cmGlobalGenerator *gg = new cmGlobalGenerator(this);
  this->SetGlobalGenerator(gg);

  // read in the list file to fill the cache
  cmsys::auto_ptr<cmLocalGenerator> lg(gg->MakeLocalGenerator());
  cmMakefile* mf = lg->GetMakefile();
  mf->SetCurrentBinaryDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());
  mf->SetCurrentSourceDirectory
    (cmSystemTools::GetCurrentWorkingDirectory());

  mf->SetArgcArgv(args);

  std::string systemFile = mf->GetModulesFile("CMakeFindPackageMode.cmake");
  mf->ReadListFile(systemFile.c_str());

  std::string language = mf->GetSafeDefinition("LANGUAGE");
  std::string mode = mf->GetSafeDefinition("MODE");
  std::string packageName = mf->GetSafeDefinition("NAME");
  bool packageFound = mf->IsOn("PACKAGE_FOUND");
  bool quiet = mf->IsOn("PACKAGE_QUIET");

  if (!packageFound)
    {
    if (!quiet)
      {
      printf("%s not found.\n", packageName.c_str());
      }
    }
  else if (mode == "EXIST")
    {
    if (!quiet)
      {
      printf("%s found.\n", packageName.c_str());
      }
    }
  else if (mode == "COMPILE")
    {
    std::string includes = mf->GetSafeDefinition("PACKAGE_INCLUDE_DIRS");
    std::vector<std::string> includeDirs;
    cmSystemTools::ExpandListArgument(includes, includeDirs);

    std::string includeFlags = lg->GetIncludeFlags(includeDirs, 0, language);

    std::string definitions = mf->GetSafeDefinition("PACKAGE_DEFINITIONS");
    printf("%s %s\n", includeFlags.c_str(), definitions.c_str());
    }
  else if (mode == "LINK")
    {
    const char* targetName = "dummy";
    std::vector<std::string> srcs;
    cmTarget* tgt = mf->AddExecutable(targetName, srcs, true);
    tgt->SetProperty("LINKER_LANGUAGE", language.c_str());

    std::string libs = mf->GetSafeDefinition("PACKAGE_LIBRARIES");
    std::vector<std::string> libList;
    cmSystemTools::ExpandListArgument(libs, libList);
    for(std::vector<std::string>::const_iterator libIt=libList.begin();
            libIt != libList.end();
            ++libIt)
      {
      mf->AddLinkLibraryForTarget(targetName, *libIt,
                                  cmTarget::GENERAL);
      }


    std::string linkLibs;
    std::string frameworkPath;
    std::string linkPath;
    std::string flags;
    std::string linkFlags;
    gg->CreateGeneratorTargets(lg.get());
    cmGeneratorTarget *gtgt = gg->GetGeneratorTarget(tgt);
    lg->GetTargetFlags(linkLibs, frameworkPath, linkPath, flags, linkFlags,
                       gtgt, false);
    linkLibs = frameworkPath + linkPath + linkLibs;

    printf("%s\n", linkLibs.c_str() );

/*    if ( use_win32 )
      {
      tgt->SetProperty("WIN32_EXECUTABLE", "ON");
      }
    if ( use_macbundle)
      {
      tgt->SetProperty("MACOSX_BUNDLE", "ON");
      }*/
    }

  // free generic one if generated
//  this->SetGlobalGenerator(0); // setting 0-pointer is not possible
//  delete gg; // this crashes inside the cmake instance

  return packageFound;
}